

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-cluster.c
# Opt level: O3

int lunpackrequest(lua_State *L)

{
  byte bVar1;
  uint uVar2;
  ulong in_RAX;
  byte *pbVar3;
  char *fmt;
  ulong uVar4;
  size_t len;
  uint uVar5;
  size_t ssz;
  ulong local_38;
  
  local_38 = in_RAX;
  pbVar3 = (byte *)luaL_checklstring(L,1,&local_38);
  bVar1 = *pbVar3;
  uVar5 = (uint)local_38;
  if (bVar1 < 2) {
    if (bVar1 == 0) {
      if (8 < (int)uVar5) {
        uVar2 = *(uint *)(pbVar3 + 5);
        lua_pushinteger(L,(ulong)*(uint *)(pbVar3 + 1));
        lua_pushinteger(L,(ulong)uVar2);
        pbVar3 = pbVar3 + 9;
        len = (size_t)(uVar5 - 9);
LAB_00116c7e:
        lua_pushlstring(L,(char *)pbVar3,len);
        return 3;
      }
      goto LAB_00116c21;
    }
    if (bVar1 != 1) {
LAB_00116b6a:
      local_38 = (ulong)(uint)(int)(char)bVar1;
      fmt = "Invalid req package type %d";
      goto LAB_00116c2e;
    }
    if (uVar5 == 0xd) {
      uVar5 = *(uint *)(pbVar3 + 5);
      uVar2 = *(uint *)(pbVar3 + 9);
      lua_pushinteger(L,(ulong)*(uint *)(pbVar3 + 1));
      lua_pushinteger(L,(ulong)uVar5);
LAB_00116b3c:
      lua_pushinteger(L,(ulong)uVar2);
      uVar5 = 1;
LAB_00116bf7:
      lua_pushboolean(L,uVar5);
      return 4;
    }
    fmt = "Invalid cluster message size %d (multi req must be 13)";
  }
  else {
    if (bVar1 - 2 < 2) {
      if ((int)uVar5 < 5) {
        luaL_error(L,"Invalid cluster multi part message");
      }
      uVar2 = *(uint *)(pbVar3 + 1);
      lua_pushboolean(L,0);
      lua_pushinteger(L,(ulong)uVar2);
      lua_pushlstring(L,(char *)(pbVar3 + 5),(ulong)(uVar5 - 5));
      uVar5 = (uint)(bVar1 == 2);
      goto LAB_00116bf7;
    }
    if (bVar1 == 0x80) {
      if (1 < (int)uVar5) {
        uVar4 = (ulong)pbVar3[1];
        if (pbVar3[1] + 6 <= (uVar5 & 0x7fffffff)) {
          lua_pushlstring(L,(char *)(pbVar3 + 2),uVar4);
          lua_pushinteger(L,(ulong)*(uint *)(pbVar3 + uVar4 + 2));
          pbVar3 = pbVar3 + uVar4 + 6;
          len = ((uVar5 & 0x7fffffff) - uVar4) - 6;
          goto LAB_00116c7e;
        }
      }
    }
    else {
      if (bVar1 != 0x81) goto LAB_00116b6a;
      if ((1 < (int)uVar5) && (uVar4 = (ulong)pbVar3[1], pbVar3[1] + 10 <= (uVar5 & 0x7fffffff))) {
        lua_pushlstring(L,(char *)(pbVar3 + 2),uVar4);
        uVar2 = *(uint *)(pbVar3 + uVar4 + 6);
        lua_pushinteger(L,(ulong)*(uint *)(pbVar3 + uVar4 + 2));
        goto LAB_00116b3c;
      }
    }
LAB_00116c21:
    fmt = "Invalid cluster message (size=%d)";
  }
  local_38 = local_38 & 0xffffffff;
LAB_00116c2e:
  luaL_error(L,fmt,local_38);
}

Assistant:

static int
lunpackrequest(lua_State *L) {
	size_t ssz;
	const char *msg = luaL_checklstring(L,1,&ssz);
	int sz = (int)ssz;
	switch (msg[0]) {
	case 0:
		return unpackreq_number(L, (const uint8_t *)msg, sz);
	case 1:
		return unpackmreq_number(L, (const uint8_t *)msg, sz);
	case 2:
	case 3:
		return unpackmreq_part(L, (const uint8_t *)msg, sz);
	case '\x80':
		return unpackreq_string(L, (const uint8_t *)msg, sz);
	case '\x81':
		return unpackmreq_string(L, (const uint8_t *)msg, sz);
	default:
		return luaL_error(L, "Invalid req package type %d", msg[0]);
	}
}